

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineInputFile::setFrameBuffer
          (DeepScanLineInputFile *this,DeepFrameBuffer *frameBuffer)

{
  PixelType tifl;
  PixelType PVar1;
  size_t ypst;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  Slice *pSVar7;
  ArgExc *pAVar8;
  char *pcVar9;
  char *pcVar10;
  InSliceInfo *pIVar11;
  DeepSlice *pDVar12;
  Channel *pCVar13;
  long lVar14;
  bool *pbVar15;
  size_type sVar16;
  reference pvVar17;
  reference ppIVar18;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  size_t i_4;
  size_t i_3;
  long i_2;
  bool fill;
  ConstIterator j_1;
  ConstIterator i;
  vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
  slices;
  Slice *sampleCountSlice;
  stringstream _iex_throw_s;
  ConstIterator i_1;
  ConstIterator j;
  ChannelList *channels;
  Lock lock;
  DeepFrameBuffer *in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  uint in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  DeepSlice *in_stack_fffffffffffffbb8;
  vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
  *in_stack_fffffffffffffbc0;
  PixelType local_414;
  char *in_stack_fffffffffffffc20;
  ChannelList *in_stack_fffffffffffffc28;
  ulong local_278;
  ulong local_270;
  long local_268;
  stringstream local_1f8 [16];
  ostream local_1e8 [376];
  const_iterator local_70;
  const_iterator local_68;
  const_iterator local_60;
  const_iterator local_58;
  ChannelList *local_40;
  DeepFrameBuffer *local_28;
  
  local_28 = in_RSI;
  IlmThread_2_5::Lock::Lock
            ((Lock *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             (Mutex *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
             SUB41((uint)in_stack_fffffffffffffb24 >> 0x18,0));
  local_40 = Header::channels((Header *)0xac5d3d);
  local_58._M_node = (_Base_ptr)DeepFrameBuffer::begin(in_stack_fffffffffffffb18);
  do {
    local_60._M_node = (_Base_ptr)DeepFrameBuffer::end(in_stack_fffffffffffffb18);
    bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                (ConstIterator *)in_stack_fffffffffffffb18);
    if (!bVar3) {
      pSVar7 = DeepFrameBuffer::getSampleCountSlice(local_28);
      if (pSVar7->base == (char *)0x0) {
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc
                  (pAVar8,"Invalid base pointer, please set a proper sample count slice.");
        __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      *(char **)(*(long *)(in_RDI + 8) + 0x1c0) = pSVar7->base;
      *(int *)(*(long *)(in_RDI + 8) + 0x1c8) = (int)pSVar7->xStride;
      *(int *)(*(long *)(in_RDI + 8) + 0x1cc) = (int)pSVar7->yStride;
      std::
      vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ::vector((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                *)0xac616a);
      ChannelList::begin((ChannelList *)in_stack_fffffffffffffb18);
      DeepFrameBuffer::begin(in_stack_fffffffffffffb18);
      while( true ) {
        DeepFrameBuffer::end(in_stack_fffffffffffffb18);
        bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    (ConstIterator *)in_stack_fffffffffffffb18);
        if (!bVar3) break;
        while( true ) {
          ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
          bVar4 = Imf_2_5::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                      (ConstIterator *)in_stack_fffffffffffffb18);
          bVar3 = false;
          if (bVar4) {
            pcVar9 = ChannelList::ConstIterator::name((ConstIterator *)0xac6278);
            pcVar10 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0xac628f);
            iVar5 = strcmp(pcVar9,pcVar10);
            bVar3 = iVar5 < 0;
          }
          if (!bVar3) break;
          pIVar11 = (InSliceInfo *)operator_new(0x48);
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0xac62ec);
          PVar1 = pCVar13->type;
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0xac6314);
          tifl = pCVar13->type;
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0xac633c);
          in_stack_fffffffffffffb20 = pCVar13->xSampling;
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0xac6365);
          in_stack_fffffffffffffb18 = (DeepFrameBuffer *)0x0;
          anon_unknown_6::InSliceInfo::InSliceInfo
                    (pIVar11,PVar1,(char *)0x0,tifl,0,0,0,in_stack_fffffffffffffb20,
                     pCVar13->ySampling,false,true,0.0);
          std::
          vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
          ::push_back((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                       *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                      (value_type *)in_stack_fffffffffffffb18);
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20))
          ;
        }
        ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
        bVar4 = Imf_2_5::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    (ConstIterator *)in_stack_fffffffffffffb18);
        bVar3 = true;
        if (!bVar4) {
          pcVar9 = ChannelList::ConstIterator::name((ConstIterator *)0xac64bc);
          pcVar10 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0xac64d3);
          iVar5 = strcmp(pcVar9,pcVar10);
          bVar3 = 0 < iVar5;
        }
        pIVar11 = (InSliceInfo *)operator_new(0x48);
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac6535);
        PVar1 = (pDVar12->super_Slice).type;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac655d);
        pcVar9 = (pDVar12->super_Slice).base;
        if (bVar3) {
          pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac6592);
          local_414 = (pDVar12->super_Slice).type;
        }
        else {
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0xac65bc);
          local_414 = pCVar13->type;
        }
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac65f2);
        in_stack_fffffffffffffbc0 =
             (vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
              *)(pDVar12->super_Slice).xStride;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac661d);
        ypst = (pDVar12->super_Slice).yStride;
        in_stack_fffffffffffffbb8 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac6648)
        ;
        in_stack_fffffffffffffb18 =
             (DeepFrameBuffer *)(long)*(int *)&(in_stack_fffffffffffffbb8->super_Slice).field_0x34;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac6673);
        in_stack_fffffffffffffb20 = (pDVar12->super_Slice).xSampling;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac6699);
        iVar5 = (pDVar12->super_Slice).ySampling;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac66ca);
        in_stack_fffffffffffffb30 = (uint)bVar3;
        anon_unknown_6::InSliceInfo::InSliceInfo
                  (pIVar11,PVar1,pcVar9,local_414,(size_t)in_stack_fffffffffffffbc0,ypst,
                   (size_t)in_stack_fffffffffffffb18,in_stack_fffffffffffffb20,iVar5,bVar3,false,
                   (pDVar12->super_Slice).fillValue);
        std::
        vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
        ::push_back((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                     *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                    (value_type *)in_stack_fffffffffffffb18);
        ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
        bVar4 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    (ConstIterator *)in_stack_fffffffffffffb18);
        bVar2 = 0;
        if (bVar4) {
          bVar2 = bVar3 ^ 1;
        }
        if (bVar2 != 0) {
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20))
          ;
        }
        DeepFrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      }
      for (local_268 = 0; lVar14 = Array<bool>::size((Array<bool> *)(*(long *)(in_RDI + 8) + 0x1b0))
          , local_268 < lVar14; local_268 = local_268 + 1) {
        pbVar15 = Array::operator_cast_to_bool_((Array *)(*(long *)(in_RDI + 8) + 0x1b0));
        pbVar15[local_268] = false;
      }
      for (local_270 = 0;
          sVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (*(long *)(in_RDI + 8) + 0x108)), local_270 < sVar16;
          local_270 = local_270 + 1) {
        pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (*(long *)(in_RDI + 8) + 0x108),local_270);
        *pvVar17 = 0;
      }
      DeepFrameBuffer::operator=
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 in_stack_fffffffffffffb18);
      for (local_278 = 0;
          sVar16 = std::
                   vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                   ::size((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                           *)(*(long *)(in_RDI + 8) + 0x138)), local_278 < sVar16;
          local_278 = local_278 + 1) {
        ppIVar18 = std::
                   vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                   ::operator[]((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                                 *)(*(long *)(in_RDI + 8) + 0x138),local_278);
        if (*ppIVar18 != (value_type)0x0) {
          operator_delete(*ppIVar18,0x48);
        }
      }
      std::
      vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ::operator=(in_stack_fffffffffffffbc0,
                  (vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                   *)in_stack_fffffffffffffbb8);
      *(undefined1 *)(*(long *)(in_RDI + 8) + 0x1d0) = 1;
      std::
      vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ::~vector((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      return;
    }
    DeepFrameBuffer::ConstIterator::name((ConstIterator *)0xac5df0);
    local_68._M_node =
         (_Base_ptr)ChannelList::find(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    local_70._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
    bVar3 = Imf_2_5::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                (ConstIterator *)in_stack_fffffffffffffb18);
    if (!bVar3) {
      pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0xac5ea6);
      iVar5 = pCVar13->xSampling;
      pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac5ecf);
      if (iVar5 != (pDVar12->super_Slice).xSampling) {
LAB_00ac5f45:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1f8);
        poVar6 = std::operator<<(local_1e8,"X and/or y subsampling factors of \"");
        pcVar9 = ChannelList::ConstIterator::name((ConstIterator *)0xac5f88);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6,"\" channel of input file \"");
        pcVar9 = fileName((DeepScanLineInputFile *)0xac5fdc);
        poVar6 = std::operator<<(poVar6,pcVar9);
        std::operator<<(poVar6,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar8,local_1f8);
        __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0xac5efa);
      iVar5 = pCVar13->ySampling;
      pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0xac5f23);
      if (iVar5 != (pDVar12->super_Slice).ySampling) goto LAB_00ac5f45;
    }
    DeepFrameBuffer::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  } while( true );
}

Assistant:

void
DeepScanLineInputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    
    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
                                "of \"" << i.name() << "\" channel "
                                "of input file \"" << fileName() << "\" are "
                                "not compatible with the frame buffer's "
                                "subsampling factors.");
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<InSliceInfo*> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (new InSliceInfo (i.channel().type,
                                               NULL,
                                               i.channel().type,
                                               0,
                                               0,
                                               0, // sampleStride
                                               i.channel().xSampling,
                                               i.channel().ySampling,
                                               false,  // fill
                                               true, // skip
                                               0.0)); // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (new InSliceInfo (j.slice().type,
                                           j.slice().base,
                                           fill? j.slice().type:
                                                 i.channel().type,
                                           j.slice().xStride,
                                           j.slice().yStride,
                                           j.slice().sampleStride,
                                           j.slice().xSampling,
                                           j.slice().ySampling,
                                           fill,
                                           false, // skip
                                           j.slice().fillValue));


        if (i != channels.end() && !fill)
            ++i;
    }

    //
    // Client may want data to be filled in multiple arrays,
    // so we reset gotSampleCount and bytesPerLine.
    //

    for (long i = 0; i < _data->gotSampleCount.size(); i++)
        _data->gotSampleCount[i] = false;
    for (size_t i = 0; i < _data->bytesPerLine.size(); i++)
        _data->bytesPerLine[i] = 0;

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
    _data->frameBufferValid = true;
}